

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ptls_openssl_create_key_exchange(ptls_key_exchange_context_t **ctx,EVP_PKEY *pkey)

{
  int iVar1;
  int iVar2;
  ec_key_st *key;
  EC_GROUP *group;
  ptls_key_exchange_algorithm_t *algo;
  st_x9_62_keyex_context_t *local_20;
  
  iVar1 = EVP_PKEY_get_id(pkey);
  if (iVar1 == 0x40a) {
    iVar1 = evp_keyex_init(&ptls_openssl_x25519,ctx,pkey);
    if (iVar1 != 0) {
      return iVar1;
    }
    EVP_PKEY_up_ref(pkey);
  }
  else {
    iVar2 = 0x204;
    if (iVar1 != 0x198) {
      return 0x204;
    }
    key = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pkey);
    group = EC_KEY_get0_group(key);
    iVar1 = EC_GROUP_get_curve_name(group);
    if (iVar1 == 0x19f) {
      algo = &ptls_openssl_secp256r1;
    }
    else if (iVar1 == 0x2cc) {
      algo = &ptls_openssl_secp521r1;
    }
    else {
      if (iVar1 != 0x2cb) goto LAB_00105ae1;
      algo = &ptls_openssl_secp384r1;
    }
    local_20 = (st_x9_62_keyex_context_t *)0x0;
    iVar2 = x9_62_create_context(algo,&local_20);
    if (iVar2 == 0) {
      local_20->privkey = (EC_KEY *)key;
      iVar2 = x9_62_setup_pubkey(local_20);
    }
    if (iVar2 == 0) {
      *ctx = &local_20->super;
    }
    else {
      if (local_20 != (st_x9_62_keyex_context_t *)0x0) {
        x9_62_free_context(local_20);
      }
      *ctx = (ptls_key_exchange_context_t *)0x0;
      if (iVar2 != 0) {
LAB_00105ae1:
        EC_KEY_free(key);
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

int ptls_openssl_create_key_exchange(ptls_key_exchange_context_t **ctx, EVP_PKEY *pkey)
{
    int ret, id;

    switch (id = EVP_PKEY_id(pkey)) {

    case EVP_PKEY_EC: {
        /* obtain eckey */
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(pkey);

        /* determine algo */
        ptls_key_exchange_algorithm_t *algo;
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            algo = &ptls_openssl_secp256r1;
            break;
#if PTLS_OPENSSL_HAVE_SECP384R1
        case NID_secp384r1:
            algo = &ptls_openssl_secp384r1;
            break;
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
        case NID_secp521r1:
            algo = &ptls_openssl_secp521r1;
            break;
#endif
        default:
            EC_KEY_free(eckey);
            return PTLS_ERROR_INCOMPATIBLE_KEY;
        }

        /* load key */
        if ((ret = x9_62_init_key(algo, ctx, eckey)) != 0) {
            EC_KEY_free(eckey);
            return ret;
        }

        return 0;
    } break;

#if PTLS_OPENSSL_HAVE_X25519
    case NID_X25519:
        if ((ret = evp_keyex_init(&ptls_openssl_x25519, ctx, pkey)) != 0)
            return ret;
        EVP_PKEY_up_ref(pkey);
        return 0;
#endif

    default:
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    }
}